

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,optional<int> *v)

{
  ostream *poVar1;
  safe_bool sVar2;
  value_type *value;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [55];
  byte local_61;
  lest local_60 [32];
  string local_40 [32];
  optional<int> *local_20;
  optional<int> *v_local;
  ostream *os_local;
  
  local_20 = v;
  v_local = (optional<int> *)os;
  poVar1 = std::operator<<(os,"[optional:");
  sVar2 = nonstd::optional_bare::optional::operator_cast_to_function_pointer((optional *)local_20);
  local_61 = 0;
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"[empty]",&local_b9);
    std::__cxx11::string::string(local_98,local_b8);
    std::__cxx11::string::string(local_40,local_98);
  }
  else {
    value = nonstd::optional_bare::optional<int>::operator*(local_20);
    to_string<int>(local_60,value);
    local_61 = 1;
    std::__cxx11::string::string(local_40,(string *)local_60);
  }
  poVar1 = std::operator<<(poVar1,local_40);
  os_local = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_40);
  if (sVar2 == 0) {
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_60);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}